

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.h
# Opt level: O0

bool wasm::Properties::isSingleConstantExpression(Expression *curr)

{
  bool bVar1;
  RefAs *pRVar2;
  bool local_21;
  RefAs *refAs;
  Expression *curr_local;
  
  pRVar2 = Expression::dynCast<wasm::RefAs>(curr);
  if ((pRVar2 == (RefAs *)0x0) ||
     ((pRVar2->op != ExternConvertAny && (pRVar2->op != AnyConvertExtern)))) {
    bVar1 = Expression::is<wasm::Const>(curr);
    local_21 = true;
    if (!bVar1) {
      bVar1 = Expression::is<wasm::RefNull>(curr);
      local_21 = true;
      if (!bVar1) {
        bVar1 = Expression::is<wasm::RefFunc>(curr);
        local_21 = true;
        if (!bVar1) {
          local_21 = Expression::is<wasm::StringConst>(curr);
        }
      }
    }
    curr_local._7_1_ = local_21;
  }
  else {
    curr_local._7_1_ = isSingleConstantExpression(pRVar2->value);
  }
  return curr_local._7_1_;
}

Assistant:

inline bool isSingleConstantExpression(const Expression* curr) {
  if (auto* refAs = curr->dynCast<RefAs>()) {
    if (refAs->op == ExternConvertAny || refAs->op == AnyConvertExtern) {
      return isSingleConstantExpression(refAs->value);
    }
  }
  return curr->is<Const>() || curr->is<RefNull>() || curr->is<RefFunc>() ||
         curr->is<StringConst>();
}